

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_purge(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  CHAR_DATA *pCVar4;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var5;
  OBJ_DATA *obj_next;
  CHAR_DATA *vnext;
  DESCRIPTOR_DATA *d;
  OBJ_DATA *obj;
  CHAR_DATA *victim;
  char buf [100];
  char arg [4608];
  CHAR_DATA *in_stack_000035c8;
  CHAR_DATA *in_stack_ffffffffffffed38;
  undefined4 in_stack_ffffffffffffed40;
  int in_stack_ffffffffffffed44;
  CHAR_DATA *in_stack_ffffffffffffed48;
  OBJ_DATA *in_stack_ffffffffffffed50;
  OBJ_DATA *in_stack_ffffffffffffed60;
  DESCRIPTOR_DATA *pDVar6;
  OBJ_DATA *local_1298;
  CHAR_DATA *local_1290;
  char local_1288 [112];
  char local_1218;
  undefined1 in_stack_ffffffffffffee1f;
  CHAR_DATA *in_stack_ffffffffffffee20;
  DESCRIPTOR_DATA *in_stack_ffffffffffffffd0;
  
  one_argument((char *)CONCAT44(in_stack_ffffffffffffed44,in_stack_ffffffffffffed40),
               (char *)in_stack_ffffffffffffed38);
  if (local_1218 == '\0') {
    pCVar4 = in_RDI->in_room->people;
    while (local_1290 = pCVar4, local_1290 != (CHAR_DATA *)0x0) {
      pCVar4 = local_1290->next_in_room;
      bVar1 = is_npc(in_stack_ffffffffffffed38);
      if (bVar1) {
        in_stack_ffffffffffffed48 = (CHAR_DATA *)local_1290->act[0];
        _Var5 = std::pow<int,int>(0,0x5944ef);
        if ((((ulong)in_stack_ffffffffffffed48 & (long)_Var5) == 0) && (local_1290 != in_RDI)) {
          extract_char(in_stack_ffffffffffffee20,(bool)in_stack_ffffffffffffee1f);
        }
      }
    }
    local_1298 = in_RDI->in_room->contents;
    while (local_1298 != (OBJ_DATA *)0x0) {
      in_stack_ffffffffffffed50 = local_1298->next_content;
      bVar1 = is_obj_stat((OBJ_DATA *)in_stack_ffffffffffffed48,in_stack_ffffffffffffed44);
      local_1298 = in_stack_ffffffffffffed50;
      if (!bVar1) {
        extract_obj(in_stack_ffffffffffffed60);
        local_1298 = in_stack_ffffffffffffed50;
      }
    }
    act((char *)in_stack_ffffffffffffed50,in_stack_ffffffffffffed48,
        (void *)CONCAT44(in_stack_ffffffffffffed44,in_stack_ffffffffffffed40),
        in_stack_ffffffffffffed38,0);
    send_to_char((char *)in_stack_ffffffffffffed50,in_stack_ffffffffffffed48);
  }
  else {
    pCVar4 = get_char_world((CHAR_DATA *)arg._4248_8_,(char *)arg._4240_8_);
    if (pCVar4 == (CHAR_DATA *)0x0) {
      send_to_char((char *)in_stack_ffffffffffffed50,in_stack_ffffffffffffed48);
    }
    else {
      bVar1 = is_npc(in_stack_ffffffffffffed38);
      if (bVar1) {
        act((char *)in_stack_ffffffffffffed50,in_stack_ffffffffffffed48,
            (void *)CONCAT44(in_stack_ffffffffffffed44,in_stack_ffffffffffffed40),
            in_stack_ffffffffffffed38,0);
        extract_char(in_stack_ffffffffffffee20,(bool)in_stack_ffffffffffffee1f);
      }
      else if (in_RDI == pCVar4) {
        send_to_char((char *)in_stack_ffffffffffffed50,in_stack_ffffffffffffed48);
      }
      else {
        iVar2 = get_trust(in_stack_ffffffffffffed38);
        iVar3 = get_trust(in_stack_ffffffffffffed38);
        if (iVar3 < iVar2) {
          act((char *)in_stack_ffffffffffffed50,in_stack_ffffffffffffed48,
              (void *)CONCAT44(iVar2,in_stack_ffffffffffffed40),in_stack_ffffffffffffed38,0);
          if (1 < pCVar4->level) {
            save_char_obj(in_stack_000035c8);
          }
          pDVar6 = pCVar4->desc;
          extract_char(in_stack_ffffffffffffee20,(bool)in_stack_ffffffffffffee1f);
          if (pDVar6 != (DESCRIPTOR_DATA *)0x0) {
            close_socket(in_stack_ffffffffffffffd0);
          }
        }
        else {
          send_to_char((char *)in_stack_ffffffffffffed50,in_stack_ffffffffffffed48);
          sprintf(local_1288,"%s tried to purge you!\n\r",in_RDI->name);
          send_to_char((char *)in_stack_ffffffffffffed50,in_stack_ffffffffffffed48);
        }
      }
    }
  }
  return;
}

Assistant:

void do_purge(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	char buf[100];
	CHAR_DATA *victim;
	OBJ_DATA *obj;
	DESCRIPTOR_DATA *d;

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		/* 'purge' */
		CHAR_DATA *vnext;
		OBJ_DATA *obj_next;

		for (victim = ch->in_room->people; victim != nullptr; victim = vnext)
		{
			vnext = victim->next_in_room;

			if (is_npc(victim) && !IS_SET(victim->act, ACT_NOPURGE) && victim != ch /* safety precaution */)
				extract_char(victim, true);
		}

		for (obj = ch->in_room->contents; obj != nullptr; obj = obj_next)
		{
			obj_next = obj->next_content;

			if (!is_obj_stat(obj, ITEM_NOPURGE))
				extract_obj(obj);
		}

		act("$n purges the room!", ch, nullptr, nullptr, TO_ROOM);
		send_to_char("Ok.\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (!is_npc(victim))
	{
		if (ch == victim)
		{
			send_to_char("Ho ho ho.\n\r", ch);
			return;
		}

		if (get_trust(ch) <= get_trust(victim))
		{
			send_to_char("Maybe that wasn't a good idea...\n\r", ch);
			sprintf(buf, "%s tried to purge you!\n\r", ch->name);
			send_to_char(buf, victim);
			return;
		}

		act("$n disintegrates $N!", ch, 0, victim, TO_NOTVICT);

		if (victim->level > 1)
			save_char_obj(victim);

		d = victim->desc;
		extract_char(victim, true);

		if (d != nullptr)
			close_socket(d);

		return;
	}

	act("$n purges $N.", ch, nullptr, victim, TO_NOTVICT);
	extract_char(victim, true);
}